

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O1

void __thiscall diy::Master::Command<void>::execute(Command<void> *this,void *b,ProxyWithLink *cp)

{
  void *local_8;
  
  local_8 = b;
  if ((this->f).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->f)._M_invoker)((_Any_data *)&this->f,&local_8,cp);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void  execute(void* b, const ProxyWithLink& cp) const override                { f(static_cast<Block*>(b), cp); }